

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::Locale::getDisplayVariant(Locale *this,Locale *displayLocale,UnicodeString *result)

{
  char *pcVar1;
  char *pcVar2;
  UChar *pUVar3;
  UBool UVar4;
  int32_t iVar5;
  char16_t *pcVar6;
  __off_t __length;
  __off_t __length_00;
  int32_t local_8c;
  int32_t local_64;
  UErrorCode local_34;
  int32_t length;
  UErrorCode errorCode;
  UChar *buffer;
  UnicodeString *result_local;
  Locale *displayLocale_local;
  Locale *this_local;
  
  local_34 = U_ZERO_ERROR;
  buffer = (UChar *)result;
  result_local = (UnicodeString *)displayLocale;
  displayLocale_local = this;
  pcVar6 = UnicodeString::getBuffer(result,0x9d);
  _length = pcVar6;
  if (pcVar6 == (char16_t *)0x0) {
    UnicodeString::truncate((UnicodeString *)buffer,(char *)0x0,__length);
    this_local = (Locale *)buffer;
  }
  else {
    pcVar1 = this->fullName;
    pcVar2 = *(char **)((long)&result_local->fUnion + 0x20);
    iVar5 = UnicodeString::getCapacity((UnicodeString *)buffer);
    iVar5 = uloc_getDisplayVariant_63(pcVar1,pcVar2,pcVar6,iVar5,&local_34);
    pUVar3 = buffer;
    UVar4 = ::U_SUCCESS(local_34);
    local_64 = iVar5;
    if (UVar4 == '\0') {
      local_64 = 0;
    }
    UnicodeString::releaseBuffer((UnicodeString *)pUVar3,local_64);
    if (local_34 == U_BUFFER_OVERFLOW_ERROR) {
      pcVar6 = UnicodeString::getBuffer((UnicodeString *)buffer,iVar5);
      _length = pcVar6;
      if (pcVar6 == (char16_t *)0x0) {
        UnicodeString::truncate((UnicodeString *)buffer,(char *)0x0,__length_00);
        return (UnicodeString *)buffer;
      }
      local_34 = U_ZERO_ERROR;
      pcVar1 = this->fullName;
      pcVar2 = *(char **)((long)&result_local->fUnion + 0x20);
      iVar5 = UnicodeString::getCapacity((UnicodeString *)buffer);
      local_8c = uloc_getDisplayVariant_63(pcVar1,pcVar2,pcVar6,iVar5,&local_34);
      pUVar3 = buffer;
      UVar4 = ::U_SUCCESS(local_34);
      if (UVar4 == '\0') {
        local_8c = 0;
      }
      UnicodeString::releaseBuffer((UnicodeString *)pUVar3,local_8c);
    }
    this_local = (Locale *)buffer;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
Locale::getDisplayVariant(const Locale &displayLocale,
                          UnicodeString &result) const {
    UChar *buffer;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t length;

    buffer=result.getBuffer(ULOC_FULLNAME_CAPACITY);
    if(buffer==0) {
        result.truncate(0);
        return result;
    }

    length=uloc_getDisplayVariant(fullName, displayLocale.fullName,
                                  buffer, result.getCapacity(),
                                  &errorCode);
    result.releaseBuffer(U_SUCCESS(errorCode) ? length : 0);

    if(errorCode==U_BUFFER_OVERFLOW_ERROR) {
        buffer=result.getBuffer(length);
        if(buffer==0) {
            result.truncate(0);
            return result;
        }
        errorCode=U_ZERO_ERROR;
        length=uloc_getDisplayVariant(fullName, displayLocale.fullName,
                                      buffer, result.getCapacity(),
                                      &errorCode);
        result.releaseBuffer(U_SUCCESS(errorCode) ? length : 0);
    }

    return result;
}